

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void httplib::detail::ssl_delete(mutex *ctx_mutex,SSL *ssl,bool shutdown_gracefully)

{
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,shutdown_gracefully) != 0) {
    SSL_shutdown((SSL *)ssl);
  }
  std::mutex::lock(ctx_mutex);
  SSL_free((SSL *)ssl);
  pthread_mutex_unlock((pthread_mutex_t *)ctx_mutex);
  return;
}

Assistant:

inline void ssl_delete(std::mutex &ctx_mutex, SSL *ssl,
                       bool shutdown_gracefully) {
  // sometimes we may want to skip this to try to avoid SIGPIPE if we know
  // the remote has closed the network connection
  // Note that it is not always possible to avoid SIGPIPE, this is merely a
  // best-efforts.
  if (shutdown_gracefully) { SSL_shutdown(ssl); }

  std::lock_guard<std::mutex> guard(ctx_mutex);
  SSL_free(ssl);
}